

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c++
# Opt level: O1

Function<void_(kj::Function<void_()>)> __thiscall
kj::anon_unknown_0::TestExceptionCallback::getThreadInitializer(TestExceptionCallback *this)

{
  ExceptionCallback *pEVar1;
  Iface *extraout_RDX;
  ExceptionCallback *in_RSI;
  Function<void_(kj::Function<void_()>)> FVar2;
  
  pEVar1 = (ExceptionCallback *)operator_new(0x10);
  pEVar1->_vptr_ExceptionCallback = (_func_int **)&PTR_operator___0064ab98;
  pEVar1->next = in_RSI;
  (this->super_ExceptionCallback)._vptr_ExceptionCallback =
       (_func_int **)
       &kj::_::
        HeapDisposer<kj::Function<void(kj::Function<void()>)>::Impl<kj::(anonymous_namespace)::TestExceptionCallback::getThreadInitializer()::{lambda(kj::Function<void()>)#1}>>
        ::instance;
  (this->super_ExceptionCallback).next = pEVar1;
  FVar2.impl.ptr = extraout_RDX;
  FVar2.impl.disposer = (Disposer *)this;
  return (Function<void_(kj::Function<void_()>)>)FVar2.impl;
}

Assistant:

Function<void(Function<void()>)> getThreadInitializer() override {
    return [&](Function<void()> func) {
      KJ_IF_SOME(callback, mainThreadCallback) {
        TestExceptionCallback exceptionCallback(context, callback);
        func();
      } else {
        TestExceptionCallback exceptionCallback(context, *this);
        func();
      }
    };
  }